

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t archive_read_format_tar_skip(archive_read *a)

{
  void *pvVar1;
  undefined8 *puVar2;
  wchar_t wVar3;
  ulong uVar4;
  int64_t iVar5;
  ulong uVar6;
  
  pvVar1 = a->format->data;
  uVar4 = 0;
  for (puVar2 = *(undefined8 **)((long)pvVar1 + 0x140); puVar2 != (undefined8 *)0x0;
      puVar2 = (undefined8 *)*puVar2) {
    if (*(int *)(puVar2 + 3) == 0) {
      if ((long)(uVar4 ^ 0x7fffffffffffffff) <= (long)puVar2[2]) goto LAB_00713e20;
      uVar4 = uVar4 + puVar2[2];
    }
  }
  uVar6 = *(ulong *)((long)pvVar1 + 0x110);
  if ((long)uVar4 < (long)*(ulong *)((long)pvVar1 + 0x110)) {
    uVar6 = uVar4;
  }
  iVar5 = __archive_read_consume
                    (a,uVar6 + *(long *)((long)pvVar1 + 0x120) + *(long *)((long)pvVar1 + 0x128));
  if (iVar5 < 0) {
LAB_00713e20:
    wVar3 = L'\xffffffe2';
  }
  else {
    *(undefined8 *)((long)pvVar1 + 0x110) = 0;
    *(undefined8 *)((long)pvVar1 + 0x120) = 0;
    *(undefined8 *)((long)pvVar1 + 0x128) = 0;
    while (puVar2 = *(undefined8 **)((long)pvVar1 + 0x140), puVar2 != (undefined8 *)0x0) {
      *(undefined8 *)((long)pvVar1 + 0x140) = *puVar2;
      free(puVar2);
    }
    *(undefined8 *)((long)pvVar1 + 0x148) = 0;
    wVar3 = L'\0';
  }
  return wVar3;
}

Assistant:

static int
archive_read_format_tar_skip(struct archive_read *a)
{
	int64_t bytes_skipped;
	int64_t request;
	struct sparse_block *p;
	struct tar* tar;

	tar = (struct tar *)(a->format->data);

	/* Do not consume the hole of a sparse file. */
	request = 0;
	for (p = tar->sparse_list; p != NULL; p = p->next) {
		if (!p->hole) {
			if (p->remaining >= INT64_MAX - request) {
				return ARCHIVE_FATAL;
			}
			request += p->remaining;
		}
	}
	if (request > tar->entry_bytes_remaining)
		request = tar->entry_bytes_remaining;
	request += tar->entry_padding + tar->entry_bytes_unconsumed;

	bytes_skipped = __archive_read_consume(a, request);
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	tar->entry_bytes_remaining = 0;
	tar->entry_bytes_unconsumed = 0;
	tar->entry_padding = 0;

	/* Free the sparse list. */
	gnu_clear_sparse_list(tar);

	return (ARCHIVE_OK);
}